

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.h
# Opt level: O3

void embree::storeTransform(AffineSpace3fa *space,RTCFormat format,float *xfm)

{
  long lVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (format == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
    *xfm = (space->l).vx.field_0.m128[0];
    xfm[1] = (space->l).vx.field_0.m128[1];
    xfm[2] = (space->l).vx.field_0.m128[2];
    xfm[3] = 0.0;
    xfm[4] = (space->l).vy.field_0.m128[0];
    xfm[5] = (space->l).vy.field_0.m128[1];
    xfm[6] = (space->l).vy.field_0.m128[2];
    xfm[7] = 0.0;
    xfm[8] = (space->l).vz.field_0.m128[0];
    xfm[9] = (space->l).vz.field_0.m128[1];
    xfm[10] = (space->l).vz.field_0.m128[2];
    xfm[0xb] = 0.0;
    xfm[0xc] = (space->p).field_0.m128[0];
    xfm[0xd] = (space->p).field_0.m128[1];
    xfm[0xe] = (space->p).field_0.m128[2];
    fVar3 = 1.0;
    lVar1 = 0x3c;
  }
  else {
    if (format == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      *xfm = (space->l).vx.field_0.m128[0];
      xfm[1] = (space->l).vx.field_0.m128[1];
      xfm[2] = (space->l).vx.field_0.m128[2];
      xfm[3] = (space->l).vy.field_0.m128[0];
      xfm[4] = (space->l).vy.field_0.m128[1];
      xfm[5] = (space->l).vy.field_0.m128[2];
      xfm[6] = (space->l).vz.field_0.m128[0];
      xfm[7] = (space->l).vz.field_0.m128[1];
      xfm[8] = (space->l).vz.field_0.m128[2];
      xfm[9] = (space->p).field_0.m128[0];
      fVar3 = (space->p).field_0.m128[1];
    }
    else {
      if (format != RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"invalid matrix format","");
        *puVar2 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar2 + 1) = 3;
        puVar2[2] = puVar2 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 2),local_38,local_38 + local_30);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      *xfm = (space->l).vx.field_0.m128[0];
      xfm[1] = (space->l).vy.field_0.m128[0];
      xfm[2] = (space->l).vz.field_0.m128[0];
      xfm[3] = (space->p).field_0.m128[0];
      xfm[4] = (space->l).vx.field_0.m128[1];
      xfm[5] = (space->l).vy.field_0.m128[1];
      xfm[6] = (space->l).vz.field_0.m128[1];
      xfm[7] = (space->p).field_0.m128[1];
      xfm[8] = (space->l).vx.field_0.m128[2];
      xfm[9] = (space->l).vy.field_0.m128[2];
      fVar3 = (space->l).vz.field_0.m128[2];
    }
    xfm[10] = fVar3;
    fVar3 = (space->p).field_0.m128[2];
    lVar1 = 0x2c;
  }
  *(float *)((long)xfm + lVar1) = fVar3;
  return;
}

Assistant:

inline void storeTransform(const AffineSpace3fa& space, RTCFormat format, float* xfm)
  {
    switch (format)
    {
    case RTC_FORMAT_FLOAT3X4_ROW_MAJOR:
      xfm[ 0] = space.l.vx.x;  xfm[ 1] = space.l.vy.x;  xfm[ 2] = space.l.vz.x;  xfm[ 3] = space.p.x;
      xfm[ 4] = space.l.vx.y;  xfm[ 5] = space.l.vy.y;  xfm[ 6] = space.l.vz.y;  xfm[ 7] = space.p.y;
      xfm[ 8] = space.l.vx.z;  xfm[ 9] = space.l.vy.z;  xfm[10] = space.l.vz.z;  xfm[11] = space.p.z;
      break;

    case RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR:
      xfm[ 0] = space.l.vx.x;  xfm[ 1] = space.l.vx.y;  xfm[ 2] = space.l.vx.z;
      xfm[ 3] = space.l.vy.x;  xfm[ 4] = space.l.vy.y;  xfm[ 5] = space.l.vy.z;
      xfm[ 6] = space.l.vz.x;  xfm[ 7] = space.l.vz.y;  xfm[ 8] = space.l.vz.z;
      xfm[ 9] = space.p.x;     xfm[10] = space.p.y;     xfm[11] = space.p.z;
      break;

    case RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR:
      xfm[ 0] = space.l.vx.x;  xfm[ 1] = space.l.vx.y;  xfm[ 2] = space.l.vx.z;  xfm[ 3] = 0.f;
      xfm[ 4] = space.l.vy.x;  xfm[ 5] = space.l.vy.y;  xfm[ 6] = space.l.vy.z;  xfm[ 7] = 0.f;
      xfm[ 8] = space.l.vz.x;  xfm[ 9] = space.l.vz.y;  xfm[10] = space.l.vz.z;  xfm[11] = 0.f;
      xfm[12] = space.p.x;     xfm[13] = space.p.y;     xfm[14] = space.p.z;     xfm[15] = 1.f;
      break;

    default:
#if !defined(__SYCL_DEVICE_ONLY__)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid matrix format");
#endif
      break;
    }
  }